

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

int gdImageColorReplaceCallback(gdImagePtr im,gdCallbackImageColor callback)

{
  int iVar1;
  int color;
  int *src;
  int *dst;
  int iVar2;
  ulong uVar3;
  size_t nmemb;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  if (callback == (gdCallbackImageColor)0x0) {
    iVar2 = 0;
  }
  else if (im->trueColor == 0) {
    src = (int *)gdCalloc((long)im->colorsTotal,4);
    if (src == (int *)0x0) {
      iVar2 = -1;
    }
    else {
      uVar4 = 0;
      for (lVar7 = 0; nmemb = (size_t)(int)uVar4, lVar7 < im->colorsTotal; lVar7 = lVar7 + 1) {
        if (im->open[lVar7] == 0) {
          uVar4 = uVar4 + 1;
          src[nmemb] = (int)lVar7;
        }
      }
      dst = (int *)gdCalloc(nmemb,4);
      if (dst == (int *)0x0) {
        iVar2 = -1;
      }
      else {
        uVar3 = 0;
        uVar6 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar6 = uVar3;
        }
        for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          iVar2 = (*callback)(im,src[uVar3]);
          dst[uVar3] = iVar2;
        }
        iVar2 = gdImageColorReplaceArray(im,(int)uVar6,src,dst);
        gdFree(dst);
      }
      gdFree(src);
    }
  }
  else {
    iVar2 = 0;
    for (lVar7 = (long)im->cy1; lVar7 <= im->cy2; lVar7 = lVar7 + 1) {
      for (lVar5 = (long)im->cx1; lVar5 <= im->cx2; lVar5 = lVar5 + 1) {
        iVar1 = im->tpixels[lVar7][lVar5];
        color = (*callback)(im,iVar1);
        if (color != iVar1) {
          gdImageSetPixel(im,(int)lVar5,(int)lVar7,color);
          iVar2 = iVar2 + 1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

BGD_DECLARE(int) gdImageColorReplaceCallback (gdImagePtr im, gdCallbackImageColor callback)
{
	int c, d, n = 0;

	if (!callback) {
		return 0;
	}
	if (im->trueColor) {
		register int x, y;

		for (y = im->cy1; y <= im->cy2; y++) {
			for (x = im->cx1; x <= im->cx2; x++) {
				c = gdImageTrueColorPixel(im, x, y);
				if ( (d = callback(im, c)) != c) {
					gdImageSetPixel(im, x, y, d);
					n++;
				}
			}
		}
	} else { /* palette */
		int *sarr, *darr;
		int k, len = 0;

		sarr = (int *)gdCalloc(im->colorsTotal, sizeof(int));
		if (!sarr) {
			return -1;
		}
		for (c = 0; c < im->colorsTotal; c++) {
			if (!im->open[c]) {
				sarr[len++] = c;
			}
		}
		darr = (int *)gdCalloc(len, sizeof(int));
		if (!darr) {
			gdFree(sarr);
			return -1;
		}
		for (k = 0; k < len; k++) {
			darr[k] = callback(im, sarr[k]);
		}
		n = gdImageColorReplaceArray(im, k, sarr, darr);
		gdFree(darr);
		gdFree(sarr);
	}
	return n;
}